

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double time_next_buffer_is_free
                 (int num_decoded_frame,int decoder_buffer_delay,FRAME_BUFFER *frame_buffer_pool,
                 double current_time)

{
  double dVar1;
  FRAME_BUFFER *pFVar2;
  double local_48;
  double presentation_time;
  FRAME_BUFFER *this_buffer;
  int i;
  double buf_free_time;
  double current_time_local;
  FRAME_BUFFER *frame_buffer_pool_local;
  int decoder_buffer_delay_local;
  int num_decoded_frame_local;
  double local_8;
  
  if (num_decoded_frame == 0) {
    local_8 = (double)decoder_buffer_delay / 90000.0;
  }
  else {
    buf_free_time = 1e+16;
    for (i = 0; i < 10; i = i + 1) {
      pFVar2 = frame_buffer_pool + i;
      if (pFVar2->decoder_ref_count == 0) {
        if (pFVar2->player_ref_count == 0) {
          return current_time;
        }
        dVar1 = pFVar2->presentation_time;
        if ((0.0 <= dVar1) && (dVar1 < buf_free_time)) {
          buf_free_time = dVar1;
        }
      }
    }
    if (1e+16 <= buf_free_time) {
      local_48 = -1.0;
    }
    else {
      local_48 = buf_free_time;
    }
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

static double time_next_buffer_is_free(int num_decoded_frame,
                                       int decoder_buffer_delay,
                                       const FRAME_BUFFER *frame_buffer_pool,
                                       double current_time) {
  if (num_decoded_frame == 0) {
    return (double)decoder_buffer_delay / 90000.0;
  }

  double buf_free_time = MAX_TIME;
  for (int i = 0; i < BUFFER_POOL_MAX_SIZE; ++i) {
    const FRAME_BUFFER *const this_buffer = &frame_buffer_pool[i];
    if (this_buffer->decoder_ref_count == 0) {
      if (this_buffer->player_ref_count == 0) {
        return current_time;
      }
      const double presentation_time = this_buffer->presentation_time;
      if (presentation_time >= 0.0 && presentation_time < buf_free_time) {
        buf_free_time = presentation_time;
      }
    }
  }
  return buf_free_time < MAX_TIME ? buf_free_time : INVALID_TIME;
}